

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetPDBDirectory
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  allocator local_29;
  OutputInfo *local_28;
  OutputInfo *info;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  info = (OutputInfo *)config;
  config_local = (string *)this;
  this_local = (cmGeneratorTarget *)__return_storage_ptr__;
  local_28 = GetOutputInfo(this,config);
  if (local_28 == (OutputInfo *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_28->PdbDir);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetPDBDirectory(const std::string& config) const
{
  if (OutputInfo const* info = this->GetOutputInfo(config)) {
    // Return the directory in which the target will be built.
    return info->PdbDir;
  }
  return "";
}